

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall
cmGeneratorTarget::GetFeature(cmGeneratorTarget *this,string *feature,string *config)

{
  ulong uVar1;
  cmGeneratorTarget *pcVar2;
  char *value_1;
  char *value;
  undefined1 local_48 [8];
  string featureConfig;
  string *config_local;
  string *feature_local;
  cmGeneratorTarget *this_local;
  
  featureConfig.field_2._8_8_ = config;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)local_48,(string *)feature);
    std::__cxx11::string::operator+=((string *)local_48,"_");
    cmsys::SystemTools::UpperCase((string *)&value,(string *)featureConfig.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    pcVar2 = (cmGeneratorTarget *)GetProperty(this,(string *)local_48);
    if (pcVar2 != (cmGeneratorTarget *)0x0) {
      this_local = pcVar2;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (pcVar2 != (cmGeneratorTarget *)0x0) {
      return (char *)this_local;
    }
  }
  this_local = (cmGeneratorTarget *)GetProperty(this,feature);
  if (this_local == (cmGeneratorTarget *)0x0) {
    this_local = (cmGeneratorTarget *)
                 cmLocalGenerator::GetFeature
                           (this->LocalGenerator,feature,(string *)featureConfig.field_2._8_8_);
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetFeature(const std::string& feature,
                                          const std::string& config) const
{
  if(!config.empty())
    {
    std::string featureConfig = feature;
    featureConfig += "_";
    featureConfig += cmSystemTools::UpperCase(config);
    if(const char* value = this->GetProperty(featureConfig))
      {
      return value;
      }
    }
  if(const char* value = this->GetProperty(feature))
    {
    return value;
    }
  return this->LocalGenerator->GetFeature(feature, config);
}